

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

escapeitem_t item_to_escapeitem(item_t item)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,item);
  if (iVar1 < 0xe) {
    if (iVar1 == 3) {
      return 2;
    }
    if (iVar1 == 6) {
      return 8;
    }
  }
  else {
    if (iVar1 == 0xe) {
      return 4;
    }
    if (iVar1 == 0xf) {
      return 1;
    }
  }
  return 0;
}

Assistant:

escapeitem_t item_to_escapeitem(item_t item)
{
  switch (item)
  {
  case item_COMPASS:
    return escapeitem_COMPASS;
  case item_PAPERS:
    return escapeitem_PAPERS;
  case item_PURSE:
    return escapeitem_PURSE;
  case item_UNIFORM:
    return escapeitem_UNIFORM;
  default:
    return 0;
  }
}